

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg.c
# Opt level: O3

keypress borg_inkey_hack(wchar_t flush_first)

{
  _Bool _Var1;
  keycode_t kVar2;
  errr eVar3;
  int iVar4;
  wchar_t wVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  keypress kVar8;
  uint8_t t_a;
  keypress key;
  wchar_t x;
  wchar_t y;
  ui_event ch_evt;
  char buffer [1024];
  uint8_t local_459;
  keypress local_458;
  wchar_t local_44c;
  wchar_t local_448;
  ui_event local_444;
  keypress local_438;
  char acStack_429 [1033];
  
  local_458.mods = '\0';
  local_458._9_3_ = 0;
  local_458.type = EVT_KBRD;
  local_458.code = 0;
  local_448 = L'\0';
  local_44c = (Term->wid + -1) / (int)(uint)tile_width;
  Term_locate(&local_44c,&local_448);
  Term_fresh();
  if (borg_active == false) {
    borg_note("# Removing keypress hook");
    inkey_hack = (_func_keypress_int *)0x0;
    borg_flush();
    flush(EVENT_MAP,(game_event_data *)0x0,(void *)0x0);
    if ((uint)key_mode < 2) {
      option_set("rogue_like_commands",key_mode);
    }
    local_458.type = EVT_KBRD;
    local_458.code = 0xe000;
    goto LAB_00257297;
  }
  if ((flush_first != L'\0') && (kVar2 = borg_inkey(false), kVar2 != 0)) {
    borg_note("# Flushing keypress buffer");
    borg_flush();
    if (0xfa < borg.time_this_panel) {
      borg_respawning = 3;
    }
  }
  borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&local_459,acStack_429 + 1);
  pcVar6 = borg_trim(acStack_429 + 1);
  if ((local_459 == '\0') ||
     ((((*pcVar6 == ' ' && (pcVar6[1] == ' ')) && (pcVar6[2] == ' ')) && (pcVar6[3] == ' ')))) {
    if (player->is_dead != true) {
LAB_00256f24:
      if (character_dungeon == false) {
LAB_00257165:
        if (*borg_cfg != 0) {
          borg_note("# Mid reincarnation, no map yet");
        }
        local_458.code = 0x9c;
        borg_respawning = borg_respawning + -1;
        if (borg_respawning < 1) {
          borg_oops("reincarnation failure");
        }
        goto LAB_00257297;
      }
LAB_00256f34:
      borg_parse((char *)0x0);
      borg_dont_react = false;
      kVar2 = borg_inkey(true);
      if (kVar2 == 0) {
        Term_inkey(&local_444,false,true);
        if (borg.trait[0x69] < 1) {
          if ((borg.in_shop & 1U) == 0) goto LAB_002571e8;
LAB_00257213:
          if (((local_444.type & EVT_SELECT) != EVT_NONE) ||
             ((local_444.type & EVT_MOVE) != EVT_NONE)) {
            local_444.type = EVT_KBRD;
          }
          if ((player->upkeep->resting != L'\0') || (wVar5 = cmd_get_nrepeats(), L'\0' < wVar5)) {
            local_458._0_8_ = local_458._0_8_ & 0xffffffff00000000;
            goto LAB_00257297;
          }
          borg_confirm_target = false;
          borg_rand_quick = Rand_quick;
          borg_rand_value = Rand_value;
          Rand_quick = true;
          Rand_value = borg_rand_local;
          do {
            _Var1 = borg_think();
          } while (!_Var1);
          borg_status();
          borg_rand_local = Rand_value;
          Rand_quick = borg_rand_quick;
          Rand_value = borg_rand_value;
          if ((borg_step != 0) && (borg_step = borg_step - 1, borg_step == 0)) {
            borg_cancel = true;
          }
          kVar2 = borg_inkey(true);
          if (kVar2 != 0) goto LAB_00256f57;
          pcVar6 = "normal abort";
        }
        else {
          borg.in_shop = false;
LAB_002571e8:
          if ((((local_444.type & EVT_KBRD) == EVT_NONE) || (local_444.key.code == 0)) ||
             (local_444.key.code == 10)) goto LAB_00257213;
          if (local_444.key.code - 0x20 < 0x5f) {
            pcVar6 = format("# User key press <%lu><%c>",(ulong)local_444.key.code,
                            (ulong)local_444.key.code);
          }
          else {
            pcVar6 = format("# User key press <%lu>");
          }
          borg_note(pcVar6);
          pcVar6 = format("# Key type was <%d><%c>",(ulong)local_444.type);
          borg_note(pcVar6);
          pcVar6 = "user abort";
        }
        borg_oops(pcVar6);
        local_458.code = 0xe000;
      }
      else {
LAB_00256f57:
        local_458.code = kVar2;
      }
      goto LAB_00257297;
    }
  }
  else {
    _Var1 = prefix(pcVar6,"Type");
    if (!_Var1) {
      if (((inkey_flag == false) && (*pcVar6 != '\0')) &&
         (_Var1 = borg_react_prompted(pcVar6,&local_458,local_44c,local_448), _Var1))
      goto LAB_00257297;
      if (player->is_dead != false) goto LAB_00256fa2;
      if (((((L'\x06' < local_44c && local_448 == L'\0') & ~inkey_flag) == 1) &&
          (eVar3 = borg_what_text(local_44c + L'\xfffffff9',L'\0',L'\a',&local_459,acStack_429 + 1),
          eVar3 == 0)) && (_Var1 = suffix(acStack_429 + 1," -more-"), _Var1)) {
        if (*borg_cfg != 0) {
          borg_note("# message with -more-");
        }
        eVar3 = borg_what_text(L'\0',L'\0',local_44c + L'\xfffffff9',&local_459,acStack_429 + 1);
        if (eVar3 == 0) {
          borg_parse(acStack_429 + 1);
        }
        if (*borg_cfg != 0) {
          borg_note("clearing -more-");
        }
      }
      else {
        if (character_dungeon == false) goto LAB_00257165;
        if (inkey_flag != true) goto LAB_00256f34;
        if (*borg_cfg != 0) {
          borg_note("# parse normal message");
        }
        eVar3 = borg_what_text(L'\0',L'\0',(Term->wid + -1) / (int)(uint)tile_width,&local_459,
                               acStack_429 + 1);
        if (eVar3 == 0) {
          uVar7 = strlen(acStack_429 + 1);
          iVar4 = (int)uVar7;
          if (0 < iVar4) {
            do {
              iVar4 = (int)uVar7;
              if (acStack_429[uVar7 & 0xffffffff] != ' ') goto LAB_00257147;
              uVar7 = (ulong)(iVar4 - 1);
            } while (1 < iVar4);
            iVar4 = 0;
          }
LAB_00257147:
          acStack_429[(long)iVar4 + 1] = '\0';
          borg_parse(acStack_429 + 1);
        }
      }
      local_458.code = 0x20;
      goto LAB_00257297;
    }
    if (player->is_dead == false) goto LAB_00256f24;
  }
LAB_00256fa2:
  if ((borg_cfg[0x1d] <= borg.trait[0x23]) ||
     (pcVar6 = strstr(player->died_from,"starvation"), pcVar6 != (char *)0x0)) {
    borg_write_map(false);
  }
  borg_log_death();
  borg_log_death_data();
  borg_flush();
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_oops("player died");
  local_458.code = 3;
LAB_00257297:
  local_438.type = local_458.type;
  local_438.code = local_458.code;
  local_438.mods = local_458.mods;
  save_keypress_history(&local_438);
  kVar8._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_438.mods);
  kVar8.type = local_438.type;
  kVar8.code = local_438.code;
  return kVar8;
}

Assistant:

static struct keypress borg_inkey_hack(int flush_first)
{
    struct keypress k = internal_borg_inkey(flush_first);

    save_keypress_history(&k);

    return k;
}